

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassConstructor
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  string *desc_00;
  ulong uVar2;
  char *pcVar3;
  Descriptor *in_RCX;
  GeneratorOptions *in_RDX;
  string message_id;
  Descriptor *in_stack_fffffffffffffe68;
  Printer *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  Descriptor *in_stack_fffffffffffffe80;
  GeneratorOptions *in_stack_fffffffffffffe88;
  GeneratorOptions *descriptor;
  GeneratorOptions *in_stack_fffffffffffffec8;
  Printer *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  Printer *in_stack_fffffffffffffee0;
  char (*in_stack_fffffffffffffee8) [6];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  char (*in_stack_fffffffffffffef8) [10];
  char *in_stack_ffffffffffffff00;
  Printer *in_stack_ffffffffffffff08;
  string local_d8 [8];
  char (*in_stack_ffffffffffffff30) [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  char (*in_stack_ffffffffffffff40) [12];
  undefined5 in_stack_ffffffffffffff48;
  byte bVar4;
  allocator in_stack_ffffffffffffff4e;
  byte bVar5;
  string local_b0 [32];
  string local_90 [32];
  string local_70 [48];
  string local_40 [32];
  Descriptor *local_20;
  GeneratorOptions *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  (anonymous_namespace)::GetMessagePathPrefix_abi_cxx11_
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  desc_00 = Descriptor::name_abi_cxx11_(local_20);
  io::Printer::Print<char[12],std::__cxx11::string,char[10],std::__cxx11::string>
            (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
             &in_stack_fffffffffffffed0->variable_delimiter_,&in_stack_fffffffffffffec8->output_dir,
             (char (*) [10])desc_00,&in_RDX->output_dir);
  std::__cxx11::string::~string(local_40);
  io::Printer::Annotate<google::protobuf::Descriptor>
            (in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,(Descriptor *)0x467b0c);
  (anonymous_namespace)::GetMessageId_abi_cxx11_(in_stack_fffffffffffffe68);
  uVar2 = std::__cxx11::string::empty();
  bVar5 = 0;
  bVar4 = 0;
  if ((uVar2 & 1) == 0) {
    std::operator+((char *)in_RDX,&local_18->output_dir);
    bVar5 = 1;
    std::operator+(in_stack_fffffffffffffe78,&in_stack_fffffffffffffe70->variable_delimiter_);
    descriptor = local_18;
  }
  else {
    bVar1 = anon_unknown_0::IsResponse(local_20);
    pcVar3 = "0";
    if (bVar1) {
      pcVar3 = "\'\'";
    }
    std::allocator<char>::allocator();
    bVar4 = 1;
    std::__cxx11::string::string(local_90,pcVar3,(allocator *)&stack0xffffffffffffff4e);
    descriptor = local_18;
  }
  (anonymous_namespace)::GetPivot_abi_cxx11_((Descriptor *)in_RDX);
  (anonymous_namespace)::RepeatedFieldsArrayName_abi_cxx11_
            (in_stack_fffffffffffffec8,(Descriptor *)desc_00);
  (anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
            (in_stack_fffffffffffffec8,(Descriptor *)desc_00);
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffee0,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar5,CONCAT16(in_stack_ffffffffffffff4e,
                                     CONCAT15(bVar4,in_stack_ffffffffffffff48))));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_90);
  if ((bVar4 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4e);
  }
  if ((bVar5 & 1) != 0) {
    std::__cxx11::string::~string(local_b0);
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_(in_RDX,(Descriptor *)descriptor);
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,(char (*) [10])desc_00,
             &in_RDX->output_dir);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void Generator::GenerateClassConstructor(const GeneratorOptions& options,
                                         io::Printer* printer,
                                         const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Generated by JsPbCodeGenerator.\n"
      " * @param {Array=} opt_data Optional initial data array, typically "
      "from a\n"
      " * server response, or constructed directly in Javascript. The array "
      "is used\n"
      " * in place and becomes part of the constructed object. It is not "
      "cloned.\n"
      " * If no data is provided, the constructed object will be empty, but "
      "still\n"
      " * valid.\n"
      " * @extends {jspb.Message}\n"
      " * @constructor\n"
      " */\n"
      "$classprefix$$classname$ = function(opt_data) {\n",
      "classprefix", GetMessagePathPrefix(options, desc), "classname",
      desc->name());
  printer->Annotate("classname", desc);
  std::string message_id = GetMessageId(desc);
  printer->Print(
      "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, "
      "$rptfields$, $oneoffields$);\n",
      "messageId",
      !message_id.empty() ? ("'" + message_id + "'")
                          : (IsResponse(desc) ? "''" : "0"),
      "pivot", GetPivot(desc), "rptfields",
      RepeatedFieldsArrayName(options, desc), "oneoffields",
      OneofFieldsArrayName(options, desc));
  printer->Print(
      "};\n"
      "goog.inherits($classname$, jspb.Message);\n"
      "if (goog.DEBUG && !COMPILED) {\n"
      // displayName overrides Function.prototype.displayName
      // http://google3/javascript/externs/es3.js?l=511
      "  /**\n"
      "   * @public\n"
      "   * @override\n"
      "   */\n"
      "  $classname$.displayName = '$classname$';\n"
      "}\n",
      "classname", GetMessagePath(options, desc));
}